

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O3

void __thiscall
Assimp::DXFImporter::ConvertMeshes(DXFImporter *this,aiScene *pScene,FileData *output)

{
  pointer paVar1;
  mapped_type_conflict3 mVar2;
  pointer pBVar3;
  pointer psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  mapped_type pBVar6;
  element_type *peVar7;
  _Base_ptr __n;
  pointer ppPVar8;
  pointer puVar9;
  PolyLine *pPVar10;
  pointer paVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  pointer pvVar15;
  bool bVar16;
  int iVar17;
  pointer pBVar18;
  Logger *this_00;
  mapped_type *ppBVar19;
  iterator iVar20;
  mapped_type_conflict3 *pmVar21;
  _Rb_tree_node_base *__s;
  aiMesh *paVar22;
  pointer ppPVar23;
  aiVector3D *__s_00;
  aiColor4D *__s_01;
  ulong *puVar24;
  aiFace *paVar25;
  uint *puVar26;
  uint *puVar27;
  long lVar28;
  runtime_error *prVar29;
  uint uVar30;
  FileData *extraout_RDX;
  ulong uVar31;
  FileData *pFVar32;
  FileData *extraout_RDX_00;
  ulong uVar33;
  aiFace *paVar34;
  ulong uVar35;
  string *this_01;
  string *__k;
  _Rb_tree_node_base *this_02;
  pointer puVar36;
  ulong uVar37;
  _Base_ptr p_Var38;
  aiVector3D *paVar39;
  Block *bl;
  mapped_type pBVar40;
  pointer psVar41;
  uint uVar42;
  Block *bl_00;
  pointer puVar43;
  uint uVar44;
  aiScene *pScene_00;
  undefined1 auVar45 [16];
  vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_> pv;
  LayerMap layers;
  vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  corr;
  BlockMap blocks_by_name;
  element_type *local_258;
  undefined8 uStack_250;
  long local_248 [3];
  aiScene *local_230;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_228;
  aiMesh *local_1f8;
  _Rb_tree_node_base *local_1f0;
  vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  local_1e8;
  pointer local_1c8;
  pointer local_1c0;
  uint *local_1b8;
  element_type *local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Base_ptr local_188;
  size_t local_180;
  ios_base local_138 [264];
  
  local_230 = pScene;
  bVar16 = DefaultLogger::isNullLogger();
  if (!bVar16) {
    pBVar3 = (output->blocks).
             super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pBVar18 = (output->blocks).
                   super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>.
                   _M_impl.super__Vector_impl_data._M_start; pBVar18 != pBVar3;
        pBVar18 = pBVar18 + 1) {
      psVar4 = (pBVar18->lines).
               super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar41 = (pBVar18->lines).
                     super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar41 != psVar4;
          psVar41 = psVar41 + 1) {
        p_Var5 = (psVar41->super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          }
        }
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
      }
    }
    this_00 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[30]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [30])"DXF: Unexpanded polycount is ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,", vertex count is ",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    Logger::debug(this_00,(char *)local_228._M_impl._0_8_);
    if ((_Base_ptr *)local_228._M_impl._0_8_ !=
        &local_228._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_228._M_impl._0_8_,
                      (ulong)((long)&(local_228._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  pBVar40 = (output->blocks).
            super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
            super__Vector_impl_data._M_start;
  pBVar6 = (output->blocks).
           super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar6 == pBVar40) {
    prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8._0_8_ = &local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"DXF: no data blocks loaded","");
    std::runtime_error::runtime_error(prVar29,(string *)local_1a8);
    *(undefined ***)prVar29 = &PTR__runtime_error_008bf448;
    __cxa_throw(prVar29,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_198._8_8_ = local_1a8 + 8;
  local_1a8._8_4_ = _S_red;
  bl_00 = (Block *)0x0;
  local_198._M_allocated_capacity = 0;
  local_180 = 0;
  local_188 = (_Base_ptr)local_198._8_8_;
  do {
    __k = &pBVar40->name;
    this_01 = (string *)local_1a8;
    ppBVar19 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
                             *)local_1a8,__k);
    *ppBVar19 = pBVar40;
    if (bl_00 == (Block *)0x0) {
      iVar17 = std::__cxx11::string::compare((char *)__k);
      this_01 = __k;
      bl_00 = (Block *)0x0;
      if (iVar17 == 0) {
        bl_00 = pBVar40;
      }
    }
    pBVar40 = pBVar40 + 1;
  } while (pBVar40 != pBVar6);
  if (bl_00 == (Block *)0x0) {
    prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_228._M_impl._0_8_ = &local_228._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,"DXF: no ENTITIES data block loaded","");
    std::runtime_error::runtime_error(prVar29,(string *)&local_228);
    *(undefined ***)prVar29 = &PTR__runtime_error_008bf448;
    __cxa_throw(prVar29,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_228._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_228._M_impl.super__Rb_tree_header._M_header;
  local_228._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_228._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_228._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1e8.
  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228._M_impl.super__Rb_tree_header._M_header._M_right =
       local_228._M_impl.super__Rb_tree_header._M_header._M_left;
  ExpandBlockReferences((DXFImporter *)this_01,bl_00,(BlockMap *)local_1a8);
  psVar41 = (bl_00->lines).
            super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (bl_00->lines).
           super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar41 != psVar4) {
    mVar2 = 0;
    do {
      peVar7 = (psVar41->super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      p_Var5 = (psVar41->super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      if ((peVar7->positions).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (peVar7->positions).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_start) {
        iVar20 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::find(&local_228,&peVar7->layer);
        if ((_Rb_tree_header *)iVar20._M_node == &local_228._M_impl.super__Rb_tree_header) {
          local_230->mNumMeshes = local_230->mNumMeshes + 1;
          pmVar21 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                  *)&local_228,&peVar7->layer);
          *pmVar21 = mVar2;
          local_258 = (element_type *)0x0;
          uStack_250 = 0;
          local_248[0] = 0;
          local_1b0 = peVar7;
          std::vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>::
          emplace_back<Assimp::DXF::PolyLine_const*>
                    ((vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>
                      *)&local_258,&local_1b0);
          std::
          vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
          ::push_back(&local_1e8,(value_type *)&local_258);
          if (local_258 != (element_type *)0x0) {
            operator_delete(local_258,local_248[0] - (long)local_258);
          }
          mVar2 = mVar2 + 1;
        }
        else {
          local_258 = peVar7;
          std::vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>::
          emplace_back<Assimp::DXF::PolyLine_const*>
                    ((vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>
                      *)(local_1e8.
                         super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + iVar20._M_node[2]._M_color),
                     (PolyLine **)&local_258);
        }
      }
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      psVar41 = psVar41 + 1;
    } while (psVar41 != psVar4);
  }
  pScene_00 = local_230;
  if ((ulong)local_230->mNumMeshes != 0) {
    uVar33 = (ulong)local_230->mNumMeshes << 3;
    __s = (_Rb_tree_node_base *)operator_new__(uVar33);
    this_02 = __s;
    memset(__s,0,uVar33);
    pScene_00->mMeshes = (aiMesh **)__s;
    pFVar32 = extraout_RDX;
    p_Var38 = local_228._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_228._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_228._M_impl.super__Rb_tree_header) {
      do {
        paVar22 = (aiMesh *)operator_new(0x520);
        paVar22->mPrimitiveTypes = 0;
        paVar22->mNumVertices = 0;
        paVar22->mNumFaces = 0;
        memset(&paVar22->mVertices,0,0xcc);
        paVar22->mBones = (aiBone **)0x0;
        paVar22->mMaterialIndex = 0;
        (paVar22->mName).length = 0;
        (paVar22->mName).data[0] = '\0';
        memset((paVar22->mName).data + 1,0x1b,0x3ff);
        paVar22->mNumAnimMeshes = 0;
        paVar22->mAnimMeshes = (aiAnimMesh **)0x0;
        paVar22->mMethod = 0;
        (paVar22->mAABB).mMin.x = 0.0;
        (paVar22->mAABB).mMin.y = 0.0;
        (paVar22->mAABB).mMin.z = 0.0;
        (paVar22->mAABB).mMax.x = 0.0;
        (paVar22->mAABB).mMax.y = 0.0;
        (paVar22->mAABB).mMax.z = 0.0;
        memset(paVar22->mColors,0,0xa0);
        pScene_00->mMeshes[p_Var38[2]._M_color] = paVar22;
        __n = p_Var38[1]._M_parent;
        if (__n < (_Base_ptr)&DAT_00000400) {
          (paVar22->mName).length = (ai_uint32)__n;
          memcpy((paVar22->mName).data,*(void **)(p_Var38 + 1),(size_t)__n);
          (paVar22->mName).data[(long)__n] = '\0';
        }
        pvVar15 = local_1e8.
                  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppPVar23 = local_1e8.
                   super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[p_Var38[2]._M_color].
                   super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppPVar8 = local_1e8.
                  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[p_Var38[2]._M_color].
                  super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppPVar23 == ppPVar8) {
          uVar44 = 0;
          uVar33 = 0;
        }
        else {
          uVar33 = 0;
          uVar44 = 0;
          do {
            puVar43 = ((*ppPVar23)->counts).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar9 = ((*ppPVar23)->counts).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            iVar17 = 0;
            if (puVar43 != puVar9) {
              iVar17 = 0;
              puVar36 = puVar43;
              do {
                iVar17 = iVar17 + *puVar36;
                puVar36 = puVar36 + 1;
              } while (puVar36 != puVar9);
            }
            uVar33 = (ulong)(uint)((int)uVar33 + iVar17);
            uVar44 = uVar44 + (int)((ulong)((long)puVar9 - (long)puVar43) >> 2);
            ppPVar23 = ppPVar23 + 1;
          } while (ppPVar23 != ppPVar8);
        }
        uVar42 = (uint)uVar33;
        local_1f8 = paVar22;
        local_1f0 = p_Var38;
        __s_00 = (aiVector3D *)operator_new__(uVar33 * 0xc);
        if (uVar42 != 0) {
          memset(__s_00,0,((uVar33 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar22->mVertices = __s_00;
        __s_01 = (aiColor4D *)operator_new__(uVar33 << 4);
        if (uVar42 != 0) {
          memset(__s_01,0,uVar33 << 4);
        }
        paVar22->mColors[0] = __s_01;
        uVar33 = (ulong)uVar44;
        puVar24 = (ulong *)operator_new__(uVar33 * 0x10 + 8);
        *puVar24 = uVar33;
        paVar34 = (aiFace *)(puVar24 + 1);
        if (uVar44 != 0) {
          paVar25 = paVar34;
          do {
            paVar25->mNumIndices = 0;
            paVar25->mIndices = (uint *)0x0;
            paVar25 = paVar25 + 1;
          } while (paVar25 != paVar34 + uVar33);
        }
        local_1f8->mFaces = paVar34;
        local_1f8->mNumVertices = uVar42;
        local_1f8->mNumFaces = uVar44;
        ppPVar23 = pvVar15[local_1f0[2]._M_color].
                   super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_1c8 = pvVar15[local_1f0[2]._M_color].
                    super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (ppPVar23 == local_1c8) {
          uVar44 = 0;
        }
        else {
          iVar17 = 0;
          uVar44 = 0;
          do {
            pPVar10 = *ppPVar23;
            puVar26 = (pPVar10->counts).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            local_1b8 = (pPVar10->counts).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            local_1c0 = ppPVar23;
            if (puVar26 != local_1b8) {
              puVar43 = (pPVar10->indices).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                uVar33 = (ulong)*puVar26;
                paVar34->mNumIndices = *puVar26;
                puVar27 = (uint *)operator_new__(uVar33 * 4);
                paVar34->mIndices = puVar27;
                if (uVar33 != 0) {
                  lVar28 = 0;
                  uVar31 = 0;
                  paVar39 = __s_00;
                  do {
                    paVar34->mIndices[uVar31] = iVar17 + (int)uVar31;
                    paVar11 = (pPVar10->positions).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    uVar35 = ((long)(pPVar10->positions).
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)paVar11 >> 2)
                             * -0x5555555555555555;
                    if (uVar35 - ((long)(pPVar10->colors).
                                        super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pPVar10->colors).
                                        super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4) != 0) {
                      __assert_fail("pl->positions.size() == pl->colors.size()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/DXF/DXFLoader.cpp"
                                    ,0x14c,
                                    "void Assimp::DXFImporter::ConvertMeshes(aiScene *, DXF::FileData &)"
                                   );
                    }
                    uVar37 = (ulong)puVar43[uVar31];
                    if (uVar35 < uVar37 || uVar35 - uVar37 == 0) {
                      prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
                      local_258 = (element_type *)local_248;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_258,"DXF: vertex index out of bounds","");
                      std::runtime_error::runtime_error(prVar29,(string *)&local_258);
                      *(undefined ***)prVar29 = &PTR__runtime_error_008bf448;
                      __cxa_throw(prVar29,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    __s_00 = paVar39 + 1;
                    paVar39->z = paVar11[uVar37].z;
                    fVar12 = paVar11[uVar37].y;
                    paVar39->x = paVar11[uVar37].x;
                    paVar39->y = fVar12;
                    paVar1 = (pPVar10->colors).
                             super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + puVar43[uVar31];
                    fVar12 = paVar1->g;
                    fVar13 = paVar1->b;
                    fVar14 = paVar1->a;
                    __s_01->r = paVar1->r;
                    __s_01->g = fVar12;
                    __s_01->b = fVar13;
                    __s_01->a = fVar14;
                    __s_01 = __s_01 + 1;
                    uVar31 = uVar31 + 1;
                    lVar28 = lVar28 + -4;
                    paVar39 = __s_00;
                  } while (uVar33 != uVar31);
                  iVar17 = iVar17 + (int)uVar31;
                  puVar43 = (pointer)((long)puVar43 - lVar28);
                }
                uVar30 = paVar34->mNumIndices - 1;
                uVar42 = 8;
                if (uVar30 < 3) {
                  uVar42 = *(uint *)(&DAT_00742b90 + (ulong)uVar30 * 4);
                }
                uVar44 = uVar44 | uVar42;
                paVar34 = paVar34 + 1;
                puVar26 = puVar26 + 1;
              } while (puVar26 != local_1b8);
            }
            ppPVar23 = local_1c0 + 1;
          } while (ppPVar23 != local_1c8);
        }
        local_1f8->mPrimitiveTypes = uVar44;
        local_1f8->mMaterialIndex = 0;
        this_02 = local_1f0;
        auVar45 = std::_Rb_tree_increment(local_1f0);
        pFVar32 = auVar45._8_8_;
        p_Var38 = auVar45._0_8_;
        pScene_00 = local_230;
      } while ((_Rb_tree_header *)p_Var38 != &local_228._M_impl.super__Rb_tree_header);
    }
    GenerateHierarchy((DXFImporter *)this_02,pScene_00,pFVar32);
    GenerateMaterials((DXFImporter *)this_02,pScene_00,extraout_RDX_00);
    std::
    vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
    ::~vector(&local_1e8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~_Rb_tree(&local_228);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
                 *)local_1a8);
    return;
  }
  prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_258 = (element_type *)local_248;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"DXF: this file contains no 3d data","");
  std::runtime_error::runtime_error(prVar29,(string *)&local_258);
  *(undefined ***)prVar29 = &PTR__runtime_error_008bf448;
  __cxa_throw(prVar29,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DXFImporter::ConvertMeshes(aiScene* pScene, DXF::FileData& output) {
    // the process of resolving all the INSERT statements can grow the
    // poly-count excessively, so log the original number.
    // XXX Option to import blocks as separate nodes?
    if (!DefaultLogger::isNullLogger()) {
        unsigned int vcount = 0, icount = 0;
        for (const DXF::Block& bl : output.blocks) {
            for (std::shared_ptr<const DXF::PolyLine> pl : bl.lines) {
                vcount += static_cast<unsigned int>(pl->positions.size());
                icount += static_cast<unsigned int>(pl->counts.size());
            }
        }

        ASSIMP_LOG_DEBUG_F("DXF: Unexpanded polycount is ", icount, ", vertex count is ", vcount);
    }

    if (! output.blocks.size()  ) {
        throw DeadlyImportError("DXF: no data blocks loaded");
    }

    DXF::Block* entities( nullptr );

    // index blocks by name
    DXF::BlockMap blocks_by_name;
    for (DXF::Block& bl : output.blocks) {
        blocks_by_name[bl.name] = &bl;
        if ( !entities && bl.name == AI_DXF_ENTITIES_MAGIC_BLOCK ) {
            entities = &bl;
        }
    }

    if (!entities) {
        throw DeadlyImportError("DXF: no ENTITIES data block loaded");
    }

    typedef std::map<std::string, unsigned int> LayerMap;

    LayerMap layers;
    std::vector< std::vector< const DXF::PolyLine*> > corr;

    // now expand all block references in the primary ENTITIES block
    // XXX this involves heavy memory copying, consider a faster solution for future versions.
    ExpandBlockReferences(*entities,blocks_by_name);

    unsigned int cur = 0;
    for (std::shared_ptr<const DXF::PolyLine> pl : entities->lines) {
        if (pl->positions.size()) {

            std::map<std::string, unsigned int>::iterator it = layers.find(pl->layer);
            if (it == layers.end()) {
                ++pScene->mNumMeshes;

                layers[pl->layer] = cur++;

                std::vector< const DXF::PolyLine* > pv;
                pv.push_back(&*pl);

                corr.push_back(pv);
            }
            else {
                corr[(*it).second].push_back(&*pl);
            }
        }
    }

    if ( 0 == pScene->mNumMeshes) {
        throw DeadlyImportError("DXF: this file contains no 3d data");
    }

    pScene->mMeshes = new aiMesh*[ pScene->mNumMeshes ] ();

    for(const LayerMap::value_type& elem : layers){
        aiMesh* const mesh =  pScene->mMeshes[elem.second] = new aiMesh();
        mesh->mName.Set(elem.first);

        unsigned int cvert = 0,cface = 0;
        for(const DXF::PolyLine* pl : corr[elem.second]){
            // sum over all faces since we need to 'verbosify' them.
            cvert += std::accumulate(pl->counts.begin(),pl->counts.end(),0);
            cface += static_cast<unsigned int>(pl->counts.size());
        }

        aiVector3D* verts = mesh->mVertices = new aiVector3D[cvert];
        aiColor4D* colors = mesh->mColors[0] = new aiColor4D[cvert];
        aiFace* faces = mesh->mFaces = new aiFace[cface];

        mesh->mNumVertices = cvert;
        mesh->mNumFaces = cface;

        unsigned int prims = 0;
        unsigned int overall_indices = 0;
        for(const DXF::PolyLine* pl : corr[elem.second]){

            std::vector<unsigned int>::const_iterator it = pl->indices.begin();
            for(unsigned int facenumv : pl->counts) {
                aiFace& face = *faces++;
                face.mIndices = new unsigned int[face.mNumIndices = facenumv];

                for (unsigned int i = 0; i < facenumv; ++i) {
                    face.mIndices[i] = overall_indices++;

                    ai_assert(pl->positions.size() == pl->colors.size());
                    if (*it >= pl->positions.size()) {
                        throw DeadlyImportError("DXF: vertex index out of bounds");
                    }

                    *verts++ = pl->positions[*it];
                    *colors++ = pl->colors[*it++];
                }

                // set primitive flags now, this saves the extra pass in ScenePreprocessor.
                switch(face.mNumIndices) {
                    case 1:
                        prims |= aiPrimitiveType_POINT;
                        break;
                    case 2:
                        prims |= aiPrimitiveType_LINE;
                        break;
                    case 3:
                        prims |= aiPrimitiveType_TRIANGLE;
                        break;
                    default:
                        prims |= aiPrimitiveType_POLYGON;
                        break;
                }
            }
        }

        mesh->mPrimitiveTypes = prims;
        mesh->mMaterialIndex = 0;
    }

    GenerateHierarchy(pScene,output);
    GenerateMaterials(pScene,output);
}